

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O1

bool __thiscall
google::protobuf::anon_unknown_19::GeneratedMessageFactory::DescriptorByNameEq::operator()
          (DescriptorByNameEq *this,DescriptorTable *lhs,string_view rhs)

{
  char *__s;
  int iVar1;
  DescriptorTable *__n;
  bool bVar2;
  
  __s = *(char **)(this + 0x10);
  __n = (DescriptorTable *)strlen(__s);
  if (__n == lhs) {
    if (__n == (DescriptorTable *)0x0) {
      bVar2 = true;
    }
    else {
      iVar1 = bcmp(__s,(void *)rhs._M_len,(size_t)__n);
      bVar2 = iVar1 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool operator()(const google::protobuf::internal::DescriptorTable* lhs,
                    absl::string_view rhs) const {
      return (*this)(lhs->filename, rhs);
    }